

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

bool CPubKey::ValidSize(vector<unsigned_char,_std::allocator<unsigned_char>_> *vch)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  pbVar1 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar2 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1) {
    bVar5 = false;
  }
  else {
    if ((*pbVar1 & 0xfe) == 2) {
      lVar4 = 0x21;
    }
    else {
      bVar3 = *pbVar1 - 4;
      if (bVar3 < 4) {
        lVar4 = *(long *)(&DAT_003f01e0 + (ulong)bVar3 * 8);
      }
      else {
        lVar4 = 0;
      }
    }
    bVar5 = (long)pbVar2 - (long)pbVar1 == lVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool static ValidSize(const std::vector<unsigned char> &vch) {
      return vch.size() > 0 && GetLen(vch[0]) == vch.size();
    }